

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O3

void __thiscall Bracket::display(Bracket *this,int indent)

{
  ostream *poVar1;
  int iVar2;
  _List_node_base *p_Var3;
  
  iVar2 = indent;
  if (0 < indent) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->func)._M_dataplus._M_p,
                      (this->func)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  p_Var3 = (this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->para) {
    do {
      (**(code **)((long)(p_Var3[1]._M_next)->_M_next + 0x10))(p_Var3[1]._M_next,indent + 1);
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->para);
  }
  if (0 < indent) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      indent = indent + -1;
    } while (indent != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void Bracket::display(int indent) {
    printSpace(indent);
    std::cout << "(" << func << std::endl;
    for (auto &i: para) {
        i->display(indent + 1);
    }
    printSpace(indent);
    std::cout << ")" << std::endl;
}